

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  sel_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  
  if (count + 0x3f < 0x40) {
    iVar10 = 0;
  }
  else {
    puVar4 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar10 = 0;
    uVar14 = 0;
    uVar17 = 0;
    do {
      if (puVar4 == (unsigned_long *)0x0) {
        uVar16 = uVar17 + 0x40;
        if (count <= uVar17 + 0x40) {
          uVar16 = count;
        }
LAB_00417fcf:
        uVar9 = uVar17;
        if (uVar17 < uVar16) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          uVar11 = uVar17 << 4 | 8;
          do {
            uVar9 = uVar17;
            if (psVar5 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar5[uVar17];
            }
            iVar1 = *(int *)((long)ldata + (uVar11 - 8));
            iVar2 = *(int *)((long)rdata + (uVar11 - 8));
            iVar3 = *(int *)((long)ldata + (uVar11 - 4));
            iVar18 = *(int *)((long)rdata + (uVar11 - 4));
            lVar7 = *(long *)((long)&ldata->months + uVar11);
            lVar8 = *(long *)((long)&rdata->months + uVar11);
            if ((iVar18 == iVar3 && iVar2 == iVar1) && (iVar18 = iVar3, lVar7 == lVar8)) {
              uVar12 = 0;
            }
            else {
              lVar20 = (long)iVar3 + lVar7 / 86400000000;
              lVar19 = (long)iVar18 + lVar8 / 86400000000;
              uVar12 = 1;
              if (((long)iVar1 + lVar20 / 0x1e == (long)iVar2 + lVar19 / 0x1e) &&
                 (lVar20 % 0x1e == lVar19 % 0x1e)) {
                uVar12 = (ulong)(lVar7 % 86400000000 != lVar8 % 86400000000);
              }
            }
            psVar6[iVar10] = (sel_t)uVar9;
            iVar10 = uVar12 + iVar10;
            uVar17 = uVar17 + 1;
            uVar11 = uVar11 + 0x10;
            uVar9 = uVar16;
          } while (uVar16 != uVar17);
        }
      }
      else {
        uVar11 = puVar4[uVar14];
        uVar16 = uVar17 + 0x40;
        if (count <= uVar17 + 0x40) {
          uVar16 = count;
        }
        uVar9 = uVar16;
        if (uVar11 != 0) {
          if (uVar11 == 0xffffffffffffffff) goto LAB_00417fcf;
          uVar9 = uVar17;
          if (uVar17 < uVar16) {
            psVar5 = sel->sel_vector;
            psVar6 = true_sel->sel_vector;
            uVar15 = uVar17 << 4 | 8;
            uVar12 = 0;
            do {
              if (psVar5 == (sel_t *)0x0) {
                sVar13 = (int)uVar17 + (int)uVar12;
              }
              else {
                sVar13 = psVar5[uVar17 + uVar12];
              }
              if ((uVar11 >> (uVar12 & 0x3f) & 1) == 0) {
                uVar9 = 0;
              }
              else {
                iVar1 = *(int *)((long)ldata + (uVar15 - 8));
                iVar2 = *(int *)((long)rdata + (uVar15 - 8));
                iVar3 = *(int *)((long)ldata + (uVar15 - 4));
                iVar18 = *(int *)((long)rdata + (uVar15 - 4));
                lVar7 = *(long *)((long)&ldata->months + uVar15);
                lVar8 = *(long *)((long)&rdata->months + uVar15);
                if ((iVar18 == iVar3 && iVar2 == iVar1) && (iVar18 = iVar3, lVar7 == lVar8)) {
                  uVar9 = 0;
                }
                else {
                  lVar20 = (long)iVar3 + lVar7 / 86400000000;
                  lVar19 = (long)iVar18 + lVar8 / 86400000000;
                  uVar9 = 1;
                  if (((long)iVar1 + lVar20 / 0x1e == (long)iVar2 + lVar19 / 0x1e) &&
                     (lVar20 % 0x1e == lVar19 % 0x1e)) {
                    uVar9 = (ulong)(lVar7 % 86400000000 != lVar8 % 86400000000);
                  }
                }
              }
              psVar6[iVar10] = sVar13;
              iVar10 = uVar9 + iVar10;
              uVar12 = uVar12 + 1;
              uVar15 = uVar15 + 0x10;
              uVar9 = uVar16;
            } while (uVar16 - uVar17 != uVar12);
          }
        }
      }
      uVar14 = uVar14 + 1;
      uVar17 = uVar9;
    } while (uVar14 != count + 0x3f >> 6);
  }
  return iVar10;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}